

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O0

void __thiscall iu_StdArray_x_iutest_x_PrintTo_Test::Body(iu_StdArray_x_iutest_x_PrintTo_Test *this)

{
  Fixed *fixed;
  array<int,_3UL> *v;
  AssertionHelper local_250;
  string local_220;
  Fixed local_1f0;
  undefined8 local_68;
  array<int,_3UL> ar;
  PrintToLogChecker ck;
  iu_StdArray_x_iutest_x_PrintTo_Test *this_local;
  
  PrintToLogChecker::PrintToLogChecker((PrintToLogChecker *)(ar._M_elems + 2),"3, 1, 4");
  local_68 = 0x100000003;
  ar._M_elems[0] = 4;
  memset(&local_1f0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
  iutest::PrintToString<std::array<int,3ul>>(&local_220,(iutest *)&local_68,v);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1f0,&local_220);
  iutest::AssertionHelper::AssertionHelper
            (&local_250,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0xda,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_250,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_250);
  std::__cxx11::string::~string((string *)&local_220);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  PrintToLogChecker::~PrintToLogChecker((PrintToLogChecker *)(ar._M_elems + 2));
  return;
}

Assistant:

IUTEST(StdArray, PrintTo)
{
    PrintToLogChecker ck("3, 1, 4");
    ::std::array<int, 3> ar = { { 3, 1, 4 } };
    IUTEST_SUCCEED() << ::iutest::PrintToString(ar);
}